

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrbtree_test.c
# Opt level: O3

void traverse(xrbt_t *rb)

{
  xrbt_iter_t iter;
  
  iter = xrbt_begin(rb);
  printf("traverse size = %u\n",(ulong)(uint)rb->size);
  for (; iter != (xrbt_iter_t)0x0; iter = xrbt_iter_next(iter)) {
    printf("[%s, %d], ",iter + 1,(ulong)*(uint *)((long)&iter[2].rb_right + 4));
  }
  putchar(10);
  return;
}

Assistant:

void traverse(xrbt_t* rb)
{
    xrbt_iter_t iter = xrbt_begin(rb);
    mystruct_t* p;

    printf("traverse size = %u\n", (unsigned)xrbt_size(rb));
    while (iter != xrbt_end(rb))
    {
        p = xrbt_iter_data(iter);
        printf("[%s, %d], ", p->key, p->value);
        iter = xrbt_iter_next(iter);
    }
    printf("\n");
}